

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  Rep *dbOptions;
  int iVar1;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  string key;
  ReadOptions opt;
  BlockContents contents;
  long *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long local_78 [2];
  ReadOptions local_68;
  Slice local_50;
  BlockContents local_40;
  
  dbOptions = this->rep_;
  if ((dbOptions->options).filter_policy != (FilterPolicy *)0x0) {
    local_68.verify_checksums = false;
    local_68.fill_cache = true;
    local_68.snapshot = (Snapshot *)0x0;
    local_68.decompress_allocator = (DecompressAllocator *)0x0;
    if ((dbOptions->options).paranoid_checks == true) {
      local_68.verify_checksums = true;
      local_68.fill_cache = true;
    }
    local_40.data.data_ = "";
    local_40.data.size_ = 0;
    ReadBlock((leveldb *)&local_88,dbOptions->file,&dbOptions->options,&local_68,
              &footer->metaindex_handle_,&local_40);
    if (local_88 == (long *)0x0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_40);
      comparator = BytewiseComparator();
      pIVar2 = Block::NewIterator(this_00,comparator);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"filter.","");
      (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::string::append((char *)&local_88);
      local_50.data_ = (char *)local_88;
      (*pIVar2->_vptr_Iterator[5])(pIVar2);
      iVar1 = (*pIVar2->_vptr_Iterator[2])(pIVar2);
      if ((char)iVar1 != '\0') {
        iVar1 = (*pIVar2->_vptr_Iterator[8])(pIVar2);
        if ((__n == CONCAT44(uStack_7c,uStack_80)) &&
           (iVar1 = bcmp((void *)CONCAT44(extraout_var,iVar1),local_88,__n), iVar1 == 0)) {
          iVar1 = (*pIVar2->_vptr_Iterator[9])(pIVar2);
          local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar1);
          ReadFilter(this,&local_50);
        }
      }
      (*pIVar2->_vptr_Iterator[1])(pIVar2);
      Block::~Block(this_00);
      operator_delete(this_00,0x18);
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
    }
    else {
      operator_delete__(local_88);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, rep_->options, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}